

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O3

void __thiscall
FastPForLib::FastBinaryPacking<16U>::encodeArray
          (FastBinaryPacking<16U> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  long lVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint32_t *out_00;
  undefined1 (*pauVar5) [64];
  uint32_t *puVar6;
  uint32_t uVar7;
  uint32_t i;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  uint32_t Bs [4];
  uint32_t local_58 [3];
  uint local_4c;
  uint32_t *local_40;
  size_t *local_38;
  
  local_38 = nvalue;
  checkifdivisibleby(length,0x40);
  out_00 = out + 1;
  *out = (uint32_t)length;
  local_40 = out;
  if (0x3f < (long)length) {
    puVar2 = in + length;
    puVar6 = in + 0x40;
    do {
      pauVar5 = (undefined1 (*) [64])in;
      lVar8 = 0;
      do {
        auVar10 = vmovdqu64_avx512f(*pauVar5);
        auVar9 = vextracti64x4_avx512f(auVar10,1);
        auVar10 = vpord_avx512f(auVar10,ZEXT3264(auVar9));
        auVar3 = vpor_avx(auVar10._0_16_,auVar10._16_16_);
        auVar4 = vpshufd_avx(auVar3,0xee);
        auVar3 = vpor_avx(auVar3,auVar4);
        auVar4 = vpshufd_avx(auVar3,0x55);
        auVar3 = vpor_avx(auVar3,auVar4);
        uVar7 = 0x20 - LZCOUNT(auVar3._0_4_);
        if (auVar3._0_4_ == 0) {
          uVar7 = 0;
        }
        lVar1 = lVar8 + 1;
        pauVar5 = pauVar5 + 1;
        local_58[lVar8] = uVar7;
        lVar8 = lVar1;
      } while (lVar1 != 4);
      lVar8 = 0;
      *out_00 = local_58[2] << 8 | local_58[1] << 0x10 | local_58[0] << 0x18 | local_4c;
      out_00 = out_00 + 1;
      pauVar5 = (undefined1 (*) [64])in;
      do {
        out_00 = fastpackwithoutmask_16((uint32_t *)pauVar5,out_00,local_58[lVar8]);
        lVar8 = lVar8 + 1;
        pauVar5 = pauVar5 + 1;
      } while (lVar8 != 4);
      puVar6 = puVar6 + 0x40;
      in = (uint32_t *)((long)in + 0x100);
    } while (puVar6 <= puVar2);
  }
  *local_38 = (long)out_00 - (long)local_40 >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    *out++ = static_cast<uint32_t>(length);
    uint32_t Bs[HowManyMiniBlocks];
    for (const uint32_t *const final = in + length; in + BlockSize <= final;
         in += BlockSize) {
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i)
        Bs[i] = maxbits(in + i * MiniBlockSize, in + (i + 1) * MiniBlockSize);
      *out++ = (Bs[0] << 24) | (Bs[1] << 16) | (Bs[2] << 8) | Bs[3];
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          out = fastpackwithoutmask_8(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 16)
          out = fastpackwithoutmask_16(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 24)
          out = fastpackwithoutmask_24(in + i * MiniBlockSize, out, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastpackwithoutmask(in + i * MiniBlockSize, out, Bs[i]);
          out += Bs[i];

        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
  }